

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

bool __thiscall Quest_Context::DoAction(Quest_Context *this,Action *action)

{
  int *piVar1;
  uchar *puVar2;
  byte bVar3;
  World *pWVar4;
  pointer ppMVar5;
  bool bVar6;
  uchar y;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  reference pvVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  size_type sVar14;
  iterator iVar15;
  __shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar16;
  Runtime_Error *pRVar17;
  Character **__args_1;
  Character *pCVar18;
  _List_node_base *p_Var19;
  string *this_01;
  string *this_02;
  deque<util::variant,_std::allocator<util::variant>_> *this_03;
  iterator *piVar20;
  pointer ppMVar21;
  uchar uVar22;
  list<Character_*,_std::allocator<Character_*>_> *plVar23;
  string state;
  short id;
  allocator<char> local_181;
  string function_name;
  shared_ptr<Quest_Context> context;
  shared_ptr<Quest_Context> context_1;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  Quest *quest;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  this_01 = &state;
  if ((this->quest->quest->info).disabled != false) {
    return false;
  }
  std::__cxx11::string::string((string *)&function_name,(string *)&(action->expr).function);
  bVar6 = std::operator==(&function_name,"setstate");
  if (bVar6) {
    pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                        (&(action->expr).args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start,0);
    util::variant::GetString_abi_cxx11_((string *)&context,pvVar11);
    util::lowercase(&state,(string *)&context);
    std::__cxx11::string::~string((string *)&context);
    EOPlus::Context::SetState(&this->super_Context,&state,true);
  }
  else {
    bVar6 = std::operator==(&function_name,"reset");
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"c",(allocator<char> *)&context);
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::find(&(this->progress)._M_t,&state);
      std::__cxx11::string::~string((string *)&state);
      if ((_Rb_tree_header *)iVar12._M_node == &(this->progress)._M_t._M_impl.super__Rb_tree_header)
      {
        bVar6 = true;
        Character::ResetQuest(this->character,this->quest->id);
        goto LAB_0016a621;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,"done",(allocator<char> *)&context);
      EOPlus::Context::SetState(&this->super_Context,&state,true);
    }
    else {
      bVar6 = std::operator==(&function_name,"resetdaily");
      if (bVar6) {
        iVar8 = quest_day();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"d",(allocator<char> *)&context);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,&state);
        *pmVar13 = (mapped_type)iVar8;
        std::__cxx11::string::~string((string *)&state);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"c",(allocator<char> *)&context);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,&state);
        *pmVar13 = *pmVar13 + 1;
        std::__cxx11::string::~string((string *)&state);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"done",(allocator<char> *)&context);
        EOPlus::Context::SetState(&this->super_Context,&state,true);
      }
      else {
        bVar6 = std::operator==(&function_name,"end");
        if (!bVar6) {
          bVar6 = std::operator==(&function_name,"startquest");
          if (bVar6) {
            piVar20 = &(action->expr).args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start;
            pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                      operator[](piVar20,0);
            iVar8 = util::variant::GetInt(pvVar11);
            id = (short)iVar8;
            Character::GetQuest((Character *)&context,(short)this->character);
            this_03 = &(action->expr).args;
            if (context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              __args_1 = &this->character;
              iVar15 = std::
                       _Rb_tree<short,_std::pair<const_short,_std::shared_ptr<Quest>_>,_std::_Select1st<std::pair<const_short,_std::shared_ptr<Quest>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
                       ::find(&((*__args_1)->world->quests)._M_t,&id);
              if ((_Rb_tree_header *)iVar15._M_node !=
                  &((*__args_1)->world->quests)._M_t._M_impl.super__Rb_tree_header) {
                quest = (Quest *)iVar15._M_node[1]._M_parent;
                std::make_shared<Quest_Context,Character*&,Quest*&>
                          ((Character **)&context_1,(Quest **)__args_1);
                this_00 = &std::
                           map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                           ::operator[](&(*__args_1)->quests,(key_type *)(iVar15._M_node + 1))->
                           super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>::operator=
                          (this_00,&context_1.
                                    super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>);
                sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size(this_03);
                if (sVar14 < 2) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&state,"begin",&local_181);
                }
                else {
                  pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                            operator[](piVar20,1);
                  util::variant::GetString_abi_cxx11_(&state,pvVar11);
                }
                EOPlus::Context::SetState
                          (&(context_1.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_Context,&state,true);
                std::__cxx11::string::~string((string *)&state);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&context_1.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
            }
            else {
              EOPlus::Context::StateName_abi_cxx11_
                        (&state,&(context.
                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->super_Context);
              bVar6 = std::operator==(&state,"done");
              std::__cxx11::string::~string((string *)&state);
              if (bVar6) {
                sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size(this_03);
                if (sVar14 < 2) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&state,"begin",(allocator<char> *)&context_1);
                }
                else {
                  pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                            operator[](piVar20,1);
                  util::variant::GetString_abi_cxx11_(&state,pvVar11);
                }
                EOPlus::Context::SetState
                          (&(context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Context,&state,true);
                std::__cxx11::string::~string((string *)&state);
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            bVar6 = std::operator==(&function_name,"resetquest");
            if (bVar6) {
              sVar7 = this->quest->id;
              pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                        operator[](&(action->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start,0);
              iVar8 = util::variant::GetInt(pvVar11);
              Character::GetQuest((Character *)&context,(short)this->character);
              if (context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&state,"c",(allocator<char> *)&context_1);
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                         ::find(&(this->progress)._M_t,&state);
                std::__cxx11::string::~string((string *)&state);
                if ((_Rb_tree_header *)iVar12._M_node ==
                    &(this->progress)._M_t._M_impl.super__Rb_tree_header) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&state,"done",(allocator<char> *)&context_1);
                  EOPlus::Context::SetState
                            (&(context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super_Context,&state,true);
                  std::__cxx11::string::~string((string *)&state);
                }
                else {
                  Character::ResetQuest(this->character,(short)iVar8);
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              bVar6 = true;
              if ((short)iVar8 == sVar7) goto LAB_0016a621;
            }
            else {
              bVar6 = std::operator==(&function_name,"setqueststate");
              if (bVar6) {
                sVar7 = this->quest->id;
                piVar20 = &(action->expr).args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start;
                pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                          operator[](piVar20,0);
                iVar8 = util::variant::GetInt(pvVar11);
                pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                          operator[](piVar20,1);
                util::variant::GetString_abi_cxx11_(&state,pvVar11);
                Character::GetQuest((Character *)&context,(short)this->character);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                this_01 = &state;
                if ((context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                     (element_type *)0x0) &&
                   (EOPlus::Context::SetState
                              (&(context.
                                 super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->super_Context,&state,true), this_01 = &state,
                   (short)iVar8 == sVar7)) goto LAB_0016a617;
              }
              else {
                bVar6 = std::operator==(&function_name,"showhint");
                if (!bVar6) {
                  bVar6 = std::operator==(&function_name,"quake");
                  if (bVar6) {
                    sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                       (&(action->expr).args);
                    if (sVar14 == 0) {
                      uVar22 = '\x05';
                    }
                    else {
                      pvVar11 = std::
                                _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                                operator[](&(action->expr).args.
                                            super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                            ._M_impl.super__Deque_impl_data._M_start,0);
                      iVar9 = util::variant::GetInt(pvVar11);
                      iVar8 = 8;
                      if (iVar9 < 8) {
                        iVar8 = iVar9;
                      }
                      uVar22 = '\x01';
                      if (1 < iVar8) {
                        uVar22 = (uchar)iVar8;
                      }
                    }
                    Map::Effect(this->character->map,MAP_EFFECT_QUAKE,uVar22);
                  }
                  else {
                    bVar6 = std::operator==(&function_name,"quakeworld");
                    if (bVar6) {
                      sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                         (&(action->expr).args);
                      if (sVar14 == 0) {
                        uVar22 = '\x05';
                      }
                      else {
                        pvVar11 = std::
                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                                  operator[](&(action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start,0);
                        iVar9 = util::variant::GetInt(pvVar11);
                        iVar8 = 8;
                        if (iVar9 < 8) {
                          iVar8 = iVar9;
                        }
                        uVar22 = '\x01';
                        if (1 < iVar8) {
                          uVar22 = (uchar)iVar8;
                        }
                      }
                      pWVar4 = this->character->world;
                      ppMVar5 = (pWVar4->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                      for (ppMVar21 = (pWVar4->maps).
                                      super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                                      super__Vector_impl_data._M_start; ppMVar21 != ppMVar5;
                          ppMVar21 = ppMVar21 + 1) {
                        if ((*ppMVar21)->exists == true) {
                          Map::Effect(*ppMVar21,MAP_EFFECT_QUAKE,uVar22);
                        }
                      }
                    }
                    else {
                      bVar6 = std::operator==(&function_name,"setmap");
                      if ((bVar6) || (bVar6 = std::operator==(&function_name,"setcoord"), bVar6)) {
                        pCVar18 = this->character;
                        piVar20 = &(action->expr).args.
                                   super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                   _M_impl.super__Deque_impl_data._M_start;
                        pvVar11 = std::
                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                                  operator[](piVar20,0);
                        iVar8 = util::variant::GetInt(pvVar11);
                        sVar7 = (short)iVar8;
                        pvVar11 = std::
                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                                  operator[](piVar20,1);
                        iVar8 = util::variant::GetInt(pvVar11);
                        uVar22 = (uchar)iVar8;
                        pvVar11 = std::
                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                                  operator[](piVar20,2);
                        iVar8 = util::variant::GetInt(pvVar11);
                        y = (uchar)iVar8;
LAB_0016ab67:
                        Character::Warp(pCVar18,sVar7,uVar22,y,WARP_ANIMATION_NONE);
                      }
                      else {
                        bVar6 = std::operator==(&function_name,"playsound");
                        if (bVar6) {
                          pCVar18 = this->character;
                          pvVar11 = std::
                                    _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                    ::operator[](&(action->expr).args.
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                          iVar8 = util::variant::GetInt(pvVar11);
                          Character::PlaySound(pCVar18,(uchar)iVar8);
                        }
                        else {
                          bVar6 = std::operator==(&function_name,"giveexp");
                          if (bVar6) {
                            pvVar11 = std::
                                      _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                      ::operator[](&(action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                            iVar8 = util::variant::GetInt(pvVar11);
                            piVar1 = &this->character->exp;
                            *piVar1 = *piVar1 + iVar8;
                            pCVar18 = this->character;
                            pWVar4 = pCVar18->map->world;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&state,"MaxExp",(allocator<char> *)&context);
                            pmVar16 = std::__detail::
                                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar4->config,&state);
                            iVar9 = util::variant::GetInt(pmVar16);
                            iVar8 = pCVar18->exp;
                            if (iVar9 < iVar8) {
                              iVar8 = iVar9;
                            }
                            this->character->exp = iVar8;
                            std::__cxx11::string::~string((string *)&state);
                            bVar6 = false;
                            while( true ) {
                              bVar3 = this->character->level;
                              pWVar4 = this->character->map->world;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&state,"MaxLevel",(allocator<char> *)&context);
                              pmVar16 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar4->config,&state);
                              iVar8 = util::variant::GetInt(pmVar16);
                              if (iVar8 <= (int)(uint)bVar3) break;
                              pCVar18 = this->character;
                              iVar8 = pCVar18->exp;
                              iVar9 = (pCVar18->map->world->exp_table)._M_elems
                                      [(ulong)pCVar18->level + 1];
                              std::__cxx11::string::~string((string *)&state);
                              if (iVar8 < iVar9) goto LAB_0016ae6b;
                              puVar2 = &this->character->level;
                              *puVar2 = *puVar2 + '\x01';
                              pWVar4 = this->character->map->world;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&state,"StatPerLevel",(allocator<char> *)&context
                                        );
                              pmVar16 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar4->config,&state);
                              iVar8 = util::variant::GetInt(pmVar16);
                              piVar1 = &this->character->statpoints;
                              *piVar1 = *piVar1 + iVar8;
                              std::__cxx11::string::~string((string *)&state);
                              pWVar4 = this->character->map->world;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&state,"SkillPerLevel",
                                         (allocator<char> *)&context);
                              pmVar16 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar4->config,&state);
                              iVar8 = util::variant::GetInt(pmVar16);
                              piVar1 = &this->character->skillpoints;
                              *piVar1 = *piVar1 + iVar8;
                              std::__cxx11::string::~string((string *)&state);
                              bVar6 = true;
                              Character::CalculateStats(this->character,true);
                            }
                            std::__cxx11::string::~string((string *)&state);
LAB_0016ae6b:
                            PacketBuilder::PacketBuilder
                                      ((PacketBuilder *)&state,PACKET_RECOVER,PACKET_REPLY,0xb);
                            PacketBuilder::AddInt((PacketBuilder *)&state,this->character->exp);
                            PacketBuilder::AddShort((PacketBuilder *)&state,this->character->karma);
                            uVar10 = 0;
                            if (bVar6) {
                              uVar10 = (uint)this->character->level;
                            }
                            PacketBuilder::AddChar((PacketBuilder *)&state,uVar10);
                            if (bVar6) {
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)&state,this->character->statpoints);
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)&state,this->character->skillpoints);
                            }
                            Character::Send(this->character,(PacketBuilder *)&state);
                            if (bVar6) {
                              plVar23 = &this->character->map->characters;
                              p_Var19 = (_List_node_base *)plVar23;
                              while (p_Var19 = (((_List_base<Character_*,_std::allocator<Character_*>_>
                                                  *)&p_Var19->_M_next)->_M_impl)._M_node.
                                               super__List_node_base._M_next,
                                    p_Var19 != (_List_node_base *)plVar23) {
                                pCVar18 = (Character *)p_Var19[1]._M_next;
                                if ((pCVar18 != this->character) &&
                                   (bVar6 = Character::InRange(this->character,pCVar18), bVar6)) {
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&context,PACKET_ITEM,PACKET_ACCEPT,2);
                                  iVar8 = Character::PlayerID(pCVar18);
                                  PacketBuilder::AddShort((PacketBuilder *)&context,iVar8);
                                  Character::Send(pCVar18,(PacketBuilder *)&context);
                                  PacketBuilder::~PacketBuilder((PacketBuilder *)&context);
                                }
                              }
                            }
                          }
                          else {
                            bVar6 = std::operator==(&function_name,"giveitem");
                            if (bVar6) {
                              piVar20 = &(action->expr).args.
                                         super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                         ._M_impl.super__Deque_impl_data._M_start;
                              pvVar11 = std::
                                        _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                        ::operator[](piVar20,0);
                              iVar8 = util::variant::GetInt(pvVar11);
                              sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                       size(&(action->expr).args);
                              if (sVar14 < 2) {
                                iVar9 = 1;
                              }
                              else {
                                pvVar11 = std::
                                          _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                          ::operator[](piVar20,1);
                                iVar9 = util::variant::GetInt(pvVar11);
                              }
                              bVar6 = Character::AddItem(this->character,(short)iVar8,iVar9);
                              if (!bVar6) goto LAB_0016aa90;
                              if (iVar8 == 1) {
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)&state,PACKET_ITEM,PACKET_GET,9);
                                PacketBuilder::AddShort((PacketBuilder *)&state,0);
                                PacketBuilder::AddShort((PacketBuilder *)&state,1);
                                PacketBuilder::AddThree((PacketBuilder *)&state,iVar9);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)&state,this->character->weight);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)&state,this->character->maxweight);
                                Character::Send(this->character,(PacketBuilder *)&state);
                              }
                              else {
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)&state,PACKET_ITEM,PACKET_OBTAIN,6);
                                PacketBuilder::AddShort((PacketBuilder *)&state,iVar8);
                                PacketBuilder::AddThree((PacketBuilder *)&state,iVar9);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)&state,this->character->weight);
                                Character::Send(this->character,(PacketBuilder *)&state);
                              }
                            }
                            else {
                              bVar6 = std::operator==(&function_name,"removeitem");
                              if (bVar6) {
                                piVar20 = &(action->expr).args.
                                           super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                           ._M_impl.super__Deque_impl_data._M_start;
                                pvVar11 = std::
                                          _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                          ::operator[](piVar20,0);
                                iVar8 = util::variant::GetInt(pvVar11);
                                sVar14 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                         size(&(action->expr).args);
                                if (sVar14 < 2) {
                                  iVar9 = 1;
                                }
                                else {
                                  pvVar11 = std::
                                            _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                            ::operator[](piVar20,1);
                                  iVar9 = util::variant::GetInt(pvVar11);
                                }
                                bVar6 = Character::DelItem(this->character,(short)iVar8,iVar9);
                                if (!bVar6) goto LAB_0016aa90;
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)&state,PACKET_ITEM,PACKET_KICK,7);
                                PacketBuilder::AddShort((PacketBuilder *)&state,iVar8);
                                iVar8 = Character::HasItem(this->character,(short)iVar8,false);
                                PacketBuilder::AddInt((PacketBuilder *)&state,iVar8);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)&state,this->character->weight);
                                Character::Send(this->character,(PacketBuilder *)&state);
                              }
                              else {
                                bVar6 = std::operator==(&function_name,"setclass");
                                if (bVar6) {
                                  pvVar11 = std::
                                            _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                            ::operator[](&(action->expr).args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                  iVar8 = util::variant::GetInt(pvVar11);
                                  this->character->clas = (uchar)iVar8;
                                  Character::CalculateStats(this->character,true);
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&state,PACKET_RECOVER,PACKET_LIST,0x20
                                            );
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,(uint)this->character->clas);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_str);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_intl)
                                  ;
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_wis);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_agi);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_con);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,*this->character->display_cha);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->maxhp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->maxtp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->maxsp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->maxweight);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->mindam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->maxdam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->accuracy);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->evade);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&state,this->character->armor);
                                  Character::Send(this->character,(PacketBuilder *)&state);
                                }
                                else {
                                  bVar6 = std::operator==(&function_name,"setrace");
                                  if (bVar6) {
                                    pvVar11 = std::
                                              _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                              ::operator[](&(action->expr).args.
                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                    iVar8 = util::variant::GetInt(pvVar11);
                                    this->character->race = (Skin)iVar8;
                                    pCVar18 = this->character;
                                    sVar7 = pCVar18->map->id;
                                    uVar22 = pCVar18->x;
                                    y = pCVar18->y;
                                    goto LAB_0016ab67;
                                  }
                                  bVar6 = std::operator==(&function_name,"removekarma");
                                  if (bVar6) {
                                    pvVar11 = std::
                                              _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                              ::operator[](&(action->expr).args.
                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                    iVar8 = util::variant::GetInt(pvVar11);
                                    piVar1 = &this->character->karma;
                                    *piVar1 = *piVar1 - iVar8;
                                    if (this->character->karma < 0) {
                                      this->character->karma = 0;
                                    }
                                    PacketBuilder::PacketBuilder
                                              ((PacketBuilder *)&state,PACKET_RECOVER,PACKET_REPLY,7
                                              );
                                    PacketBuilder::AddInt
                                              ((PacketBuilder *)&state,this->character->exp);
                                    PacketBuilder::AddShort
                                              ((PacketBuilder *)&state,this->character->karma);
                                    PacketBuilder::AddChar((PacketBuilder *)&state,0);
                                    Character::Send(this->character,(PacketBuilder *)&state);
                                  }
                                  else {
                                    bVar6 = std::operator==(&function_name,"givekarma");
                                    if (!bVar6) {
                                      bVar6 = std::operator==(&function_name,"settitle");
                                      if (bVar6) {
                                        pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](&(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                        util::variant::GetString_abi_cxx11_(&state,pvVar11);
                                        this_02 = (string *)&this->character->title;
                                      }
                                      else {
                                        bVar6 = std::operator==(&function_name,"setfiance");
                                        if (bVar6) {
                                          pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](&(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                          util::variant::GetString_abi_cxx11_(&state,pvVar11);
                                          this_02 = (string *)&this->character->fiance;
                                        }
                                        else {
                                          bVar6 = std::operator==(&function_name,"setpartner");
                                          if (bVar6) {
                                            pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](&(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                            util::variant::GetString_abi_cxx11_(&state,pvVar11);
                                            this_02 = (string *)&this->character->partner;
                                          }
                                          else {
                                            bVar6 = std::operator==(&function_name,"sethome");
                                            if (!bVar6) {
                                              bVar6 = std::operator==(&function_name,"setstat");
                                              if (bVar6) {
                                                piVar20 = &(action->expr).args.
                                                                                                                      
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start;
                                                pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,0);
                                                util::variant::GetString_abi_cxx11_(&state,pvVar11);
                                                pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,1);
                                                uVar10 = util::variant::GetInt(pvVar11);
                                                std::__cxx11::string::string
                                                          ((string *)&local_e0,(string *)&state);
                                                local_58._8_4_ = 0;
                                                local_58._M_pod_data[0xc] = SIT_STAND;
                                                local_58._13_3_ = 0;
                                                local_58._4_4_ = 0;
                                                local_58._0_4_ = uVar10;
                                                local_40 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:724:26)>
                                                  ::_M_invoke;
                                                local_48 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:724:26)>
                                                  ::_M_manager;
                                                bVar6 = modify_stat(&local_e0,
                                                                    (function<int_(int)> *)&local_58
                                                                    ,this->character);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&local_58);
                                                std::__cxx11::string::~string((string *)&local_e0);
                                                this_01 = &state;
                                                if (!bVar6) {
                                                  pRVar17 = (Runtime_Error *)
                                                            __cxa_allocate_exception(0x10);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&context,"Unknown stat: ",&state);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar17,(string *)&context);
                                                  __cxa_throw(pRVar17,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              std::runtime_error::~runtime_error);
                                                }
                                              }
                                              else {
                                                bVar6 = std::operator==(&function_name,"givestat");
                                                if (bVar6) {
                                                  piVar20 = &(action->expr).args.
                                                                                                                          
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start;
                                                  pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,0);
                                                  util::variant::GetString_abi_cxx11_
                                                            (&state,pvVar11);
                                                  pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,1);
                                                  uVar10 = util::variant::GetInt(pvVar11);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_100,(string *)&state);
                                                  local_78._8_4_ = 0;
                                                  local_78._12_4_ = 0;
                                                  local_78._4_4_ = 0;
                                                  local_78._0_4_ = uVar10;
                                                  local_60 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:732:26)>
                                                  ::_M_invoke;
                                                  local_68 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:732:26)>
                                                  ::_M_manager;
                                                  bVar6 = modify_stat(&local_100,
                                                                      (function<int_(int)> *)
                                                                      &local_78,this->character);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&local_78);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_100);
                                                  this_01 = &state;
                                                  if (!bVar6) {
                                                    pRVar17 = (Runtime_Error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&context,"Unknown stat: ",&state);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar17,(string *)&context);
                                                  __cxa_throw(pRVar17,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              std::runtime_error::~runtime_error);
                                                  }
                                                }
                                                else {
                                                  bVar6 = std::operator==(&function_name,
                                                                          "removestat");
                                                  if (bVar6) {
                                                    piVar20 = &(action->expr).args.
                                                                                                                              
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start;
                                                  pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,0);
                                                  util::variant::GetString_abi_cxx11_
                                                            (&state,pvVar11);
                                                  pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](piVar20,1);
                                                  uVar10 = util::variant::GetInt(pvVar11);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_120,(string *)&state);
                                                  local_98._8_4_ = 0;
                                                  local_98._12_4_ = 0;
                                                  local_98._4_4_ = 0;
                                                  local_98._0_4_ = uVar10;
                                                  local_80 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:740:26)>
                                                  ::_M_invoke;
                                                  local_88 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:740:26)>
                                                  ::_M_manager;
                                                  bVar6 = modify_stat(&local_120,
                                                                      (function<int_(int)> *)
                                                                      &local_98,this->character);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&local_98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_120);
                                                  this_01 = &state;
                                                  if (!bVar6) {
                                                    pRVar17 = (Runtime_Error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&context,"Unknown stat: ",&state);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar17,(string *)&context);
                                                  __cxa_throw(pRVar17,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              std::runtime_error::~runtime_error);
                                                  }
                                                  }
                                                  else {
                                                    bVar6 = std::operator==(&function_name,"roll");
                                                    if (!bVar6) goto LAB_0016aa90;
                                                    pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](&(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                                  util::variant::GetInt(pvVar11);
                                                  iVar8 = util::rand();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&state,"r",
                                                             (allocator<char> *)&context);
                                                  pmVar13 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                                                  ::operator[](&this->progress,&state);
                                                  *pmVar13 = (mapped_type)iVar8;
                                                  }
                                                }
                                              }
                                              goto LAB_0016a960;
                                            }
                                            pvVar11 = std::
                                                  _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                                  ::operator[](&(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                            util::variant::GetString_abi_cxx11_(&state,pvVar11);
                                            this_02 = (string *)&this->character->home;
                                          }
                                        }
                                      }
                                      std::__cxx11::string::operator=(this_02,(string *)&state);
                                      this_01 = &state;
                                      goto LAB_0016a960;
                                    }
                                    pvVar11 = std::
                                              _Deque_iterator<util::variant,_util::variant_&,_util::variant_*>
                                              ::operator[](&(action->expr).args.
                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start,0);
                                    iVar8 = util::variant::GetInt(pvVar11);
                                    piVar1 = &this->character->karma;
                                    *piVar1 = *piVar1 + iVar8;
                                    if (2000 < this->character->karma) {
                                      this->character->karma = 2000;
                                    }
                                    PacketBuilder::PacketBuilder
                                              ((PacketBuilder *)&state,PACKET_RECOVER,PACKET_REPLY,7
                                              );
                                    PacketBuilder::AddInt
                                              ((PacketBuilder *)&state,this->character->exp);
                                    PacketBuilder::AddShort
                                              ((PacketBuilder *)&state,this->character->karma);
                                    PacketBuilder::AddChar((PacketBuilder *)&state,0);
                                    Character::Send(this->character,(PacketBuilder *)&state);
                                  }
                                }
                              }
                            }
                          }
                          PacketBuilder::~PacketBuilder((PacketBuilder *)&state);
                        }
                      }
                    }
                  }
                  goto LAB_0016aa90;
                }
                pCVar18 = this->character;
                pvVar11 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                          operator[](&(action->expr).args.
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start,0);
                util::variant::GetString_abi_cxx11_(&local_c0,pvVar11);
                (*(pCVar18->super_Command_Source)._vptr_Command_Source[6])(pCVar18,&local_c0);
                this_01 = &local_c0;
              }
LAB_0016a960:
              std::__cxx11::string::~string((string *)this_01);
            }
          }
LAB_0016aa90:
          bVar6 = false;
          goto LAB_0016a621;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"end",(allocator<char> *)&context);
        EOPlus::Context::SetState(&this->super_Context,&state,true);
      }
    }
  }
LAB_0016a617:
  std::__cxx11::string::~string((string *)&state);
  bVar6 = true;
LAB_0016a621:
  std::__cxx11::string::~string((string *)&function_name);
  return bVar6;
}

Assistant:

bool Quest_Context::DoAction(const EOPlus::Action& action)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = action.expr.function;

	if (function_name == "setstate")
	{
		std::string state = util::lowercase(action.expr.args[0]);
		this->SetState(state);
		return true;
	}
	else if (function_name == "reset")
	{
		if (this->progress.find("c") == this->progress.end())
		{
			this->character->ResetQuest(this->quest->ID());
		}
		else
		{
			this->SetState("done");
		}

		return true;
		// *this may not be valid after this point
	}
	else if (function_name == "resetdaily")
	{
		this->progress["d"] = quest_day();
		++this->progress["c"];
		this->SetState("done");
		return true;
	}
	else if (function_name == "end")
	{
		this->SetState("end");
		return true;
	}
	else if (function_name == "startquest")
	{
		short id = int(action.expr.args[0]);

		auto context = character->GetQuest(id);

		if (!context)
		{
			auto it = this->character->world->quests.find(id);

			if (it != this->character->world->quests.end())
			{
				// WARNING: holds a non-tracked reference to shared_ptr
				Quest* quest = it->second.get();
				auto context = std::make_shared<Quest_Context>(this->character, quest);
				this->character->quests[it->first] = context;
				context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
			}
		}
		else if (context->StateName() == "done")
		{
			context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
		}
	}
	else if (function_name == "resetquest")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);

		auto context = this->character->GetQuest(id);

		if (context)
		{
			if (this->progress.find("c") == this->progress.end())
				context->SetState("done");
			else
				this->character->ResetQuest(id);
		}

		if (id == this_id)
		{
			return true;
			// *this is not valid after this point
		}
	}
	else if (function_name == "setqueststate")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);
		std::string state = std::string(action.expr.args[1]);

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest_Context* quest = this->character->GetQuest(id).get();

		if (quest)
		{
			quest->SetState(state);

			if (id == this_id)
				return true;
		}
	}
	else if (function_name == "showhint")
	{
		this->character->StatusMsg(action.expr.args[0]);
	}
	else if (function_name == "quake")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		this->character->map->Effect(MAP_EFFECT_QUAKE, strength);
	}
	else if (function_name == "quakeworld")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		UTIL_FOREACH(this->character->world->maps, map)
		{
			if (map->exists)
				map->Effect(MAP_EFFECT_QUAKE, strength);
		}
	}
	else if (function_name == "setmap" || function_name == "setcoord")
	{
		this->character->Warp(int(action.expr.args[0]), int(action.expr.args[1]), int(action.expr.args[2]));
	}
	else if (function_name == "playsound")
	{
		this->character->PlaySound(int(action.expr.args[0]));
	}
	else if (function_name == "giveexp")
	{
		bool level_up = false;

		this->character->exp += int(action.expr.args[0]);

		this->character->exp = std::min(this->character->exp, int(this->character->map->world->config["MaxExp"]));

		while (this->character->level < int(this->character->map->world->config["MaxLevel"])
		 && this->character->exp >= this->character->map->world->exp_table[this->character->level+1])
		{
			level_up = true;
			++this->character->level;
			this->character->statpoints += int(this->character->map->world->config["StatPerLevel"]);
			this->character->skillpoints += int(this->character->map->world->config["SkillPerLevel"]);
			this->character->CalculateStats();
		}

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(level_up ? this->character->level : 0);

		if (level_up)
		{
			builder.AddShort(this->character->statpoints);
			builder.AddShort(this->character->skillpoints);
		}

		this->character->Send(builder);

		if (level_up)
		{
			UTIL_FOREACH(this->character->map->characters, character)
			{
				if (character != this->character && this->character->InRange(character))
				{
					PacketBuilder builder(PACKET_ITEM, PACKET_ACCEPT, 2);
					builder.AddShort(character->PlayerID());
					character->Send(builder);
				}
			}
		}
	}
	else if (function_name == "giveitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->AddItem(id, amount))
		{
			if (id == 1)
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_GET, 9);
				builder.AddShort(0); // UID
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				builder.AddChar(this->character->maxweight);
				this->character->Send(builder);
			}
			else
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_OBTAIN, 6);
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				this->character->Send(builder);
			}
		}
	}
	else if (function_name == "removeitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->DelItem(id, amount))
		{
			PacketBuilder builder(PACKET_ITEM, PACKET_KICK, 7);
			builder.AddShort(id);
			builder.AddInt(this->character->HasItem(id));
			builder.AddChar(this->character->weight);
			this->character->Send(builder);
		}
	}
	else if (function_name == "setclass")
	{
		this->character->clas = int(action.expr.args[0]);

		this->character->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		builder.AddShort(this->character->clas);
		builder.AddShort(this->character->display_str);
		builder.AddShort(this->character->display_intl);
		builder.AddShort(this->character->display_wis);
		builder.AddShort(this->character->display_agi);
		builder.AddShort(this->character->display_con);
		builder.AddShort(this->character->display_cha);
		builder.AddShort(this->character->maxhp);
		builder.AddShort(this->character->maxtp);
		builder.AddShort(this->character->maxsp);
		builder.AddShort(this->character->maxweight);
		builder.AddShort(this->character->mindam);
		builder.AddShort(this->character->maxdam);
		builder.AddShort(this->character->accuracy);
		builder.AddShort(this->character->evade);
		builder.AddShort(this->character->armor);

		this->character->Send(builder);
	}
	else if (function_name == "setrace")
	{
		this->character->race = Skin(int(action.expr.args[0]));
		this->character->Warp(this->character->map->id, this->character->x, this->character->y);
	}
	else if (function_name == "removekarma")
	{
		this->character->karma -= int(action.expr.args[0]);

		if (this->character->karma < 0)
			this->character->karma = 0;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "givekarma")
	{
		this->character->karma += int(action.expr.args[0]);

		if (this->character->karma > 2000)
			this->character->karma = 2000;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "settitle")
	{
		this->character->title = std::string(action.expr.args[0]);
	}
	else if (function_name == "setfiance")
	{
		this->character->fiance = std::string(action.expr.args[0]);
	}
	else if (function_name == "setpartner")
	{
		this->character->partner = std::string(action.expr.args[0]);
	}
	else if (function_name == "sethome")
	{
		this->character->home = std::string(action.expr.args[0]);
	}
	else if (function_name == "setstat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int) { return value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "givestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x + value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "removestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x - value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "roll")
	{
		this->progress["r"] = util::rand(1, int(action.expr.args[0]));
	}

	return false;
}